

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

void XXH_alignedFree(void *p)

{
  long in_RDI;
  xxh_u8 *base;
  xxh_u8 offset;
  xxh_u8 *ptr;
  
  if (in_RDI != 0) {
    XXH_free((void *)0x1284db);
  }
  return;
}

Assistant:

static void XXH_alignedFree(void* p) {
  if (p != NULL) {
    xxh_u8* ptr = (xxh_u8*)p;
    /* Get the offset byte we added in XXH_malloc. */
    xxh_u8 offset = ptr[-1];
    /* Free the original malloc'd pointer */
    xxh_u8* base = ptr - offset;
    XXH_free(base);
  }
}